

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorUtil.c
# Opt level: O1

int CountLiteralsCheck(void)

{
  short sVar1;
  varvalue vVar2;
  Cube *pC;
  uint uVar3;
  uint uVar4;
  int Var;
  
  uVar3 = 0;
  pC = IterCubeSetStart();
  uVar4 = 0;
  if (pC != (Cube *)0x0) {
    uVar4 = 0;
    uVar3 = 0;
    do {
      if (pC->fMark != '\0') {
        __assert_fail("p->fMark == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exorUtil.c"
                      ,0x61,"int CountLiteralsCheck()");
      }
      sVar1 = pC->a;
      if (0 < g_CoverInfo.nVarsIn) {
        Var = 0;
        do {
          vVar2 = GetVar(pC,Var);
          if (vVar2 != VAR_ABS) {
            if ((vVar2 != VAR_POS) && (vVar2 != VAR_NEG)) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exorUtil.c"
                            ,0x6d,"int CountLiteralsCheck()");
            }
            uVar3 = uVar3 + 1;
          }
          Var = Var + 1;
        } while (Var < g_CoverInfo.nVarsIn);
      }
      uVar4 = uVar4 + (int)sVar1;
      pC = IterCubeSetNext();
    } while (pC != (Cube *)0x0);
  }
  if (uVar4 != uVar3) {
    printf("Warning! The recorded number of literals (%d) differs from the actual number (%d)\n",
           (ulong)uVar4,(ulong)uVar3);
  }
  return uVar3;
}

Assistant:

int CountLiteralsCheck()
{
    Cube* p;
    int Value, v;
    int LitCounter = 0;
    int LitCounterControl = 0;

    for ( p = IterCubeSetStart( ); p; p = IterCubeSetNext() )
    {
        LitCounterControl += p->a;

        assert( p->fMark == 0 );

        // write the input variables
        for ( v = 0; v < g_CoverInfo.nVarsIn; v++ )
        {
            Value = GetVar( p, v );
            if ( Value == VAR_NEG )
                LitCounter++;
            else if ( Value == VAR_POS )
                LitCounter++;
            else if ( Value != VAR_ABS )
            {
                assert(0);
            }
        }
    }

    if ( LitCounterControl != LitCounter )
        printf( "Warning! The recorded number of literals (%d) differs from the actual number (%d)\n", LitCounterControl, LitCounter );
    return LitCounter;
}